

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::GetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat *aContentFormat)

{
  bool bVar1;
  ContentFormat CVar2;
  Error *aError;
  ErrorCode local_60 [4];
  Error local_50;
  type local_28;
  undefined1 local_21;
  uint32_t value;
  ContentFormat *aContentFormat_local;
  Message *this_local;
  Error *error;
  
  local_21 = 0;
  _value = aContentFormat;
  aContentFormat_local = (ContentFormat *)this;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  GetOption(&local_50,this,&local_28,kContentFormat);
  aError = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    CVar2 = utils::from_underlying<ot::commissioner::coap::ContentFormat>(local_28);
    *_value = CVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetContentFormat(ContentFormat &aContentFormat) const
{
    Error    error;
    uint32_t value;

    SuccessOrExit(error = GetOption(value, OptionType::kContentFormat));
    aContentFormat = utils::from_underlying<ContentFormat>(value);

exit:
    return error;
}